

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd7.c
# Opt level: O3

Bool Ppmd_RangeDec_Init(CPpmd7z_RangeDec *p)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  
  p->Low = 0;
  p->Bottom = 0;
  p->Range = 0xffffffff;
  uVar2 = p->Code;
  iVar3 = 4;
  do {
    bVar1 = (*p->Stream->Read)(p->Stream);
    uVar2 = (uint)bVar1 | uVar2 << 8;
    p->Code = uVar2;
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  return (Bool)(uVar2 != 0xffffffff);
}

Assistant:

static Bool Ppmd_RangeDec_Init(CPpmd7z_RangeDec *p)
{
  unsigned i;
  p->Low = p->Bottom = 0;
  p->Range = 0xFFFFFFFF;
  for (i = 0; i < 4; i++)
    p->Code = (p->Code << 8) | p->Stream->Read((void *)p->Stream);
  return (p->Code < 0xFFFFFFFF);
}